

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O3

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MFace>
          (Structure *this,MFace *dest,FileDatabase *db)

{
  ReadField<2,int>(this,&dest->v1,"v1",db);
  ReadField<2,int>(this,&dest->v2,"v2",db);
  ReadField<2,int>(this,&dest->v3,"v3",db);
  ReadField<2,int>(this,&dest->v4,"v4",db);
  ReadField<2,int>(this,&dest->mat_nr,"mat_nr",db);
  ReadField<1,char>(this,&dest->flag,"flag",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<MFace> (
    MFace& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.v1,"v1",db);
    ReadField<ErrorPolicy_Fail>(dest.v2,"v2",db);
    ReadField<ErrorPolicy_Fail>(dest.v3,"v3",db);
    ReadField<ErrorPolicy_Fail>(dest.v4,"v4",db);
    ReadField<ErrorPolicy_Fail>(dest.mat_nr,"mat_nr",db);
    ReadField<ErrorPolicy_Igno>(dest.flag,"flag",db);

    db.reader->IncPtr(size);
}